

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsCharLiteralTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  bool bVar1;
  char *__lhs;
  ostream *in_RSI;
  byte in_DIL;
  int in_stack_0000013c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  ostream *local_10;
  byte local_5;
  
  __lhs = (char *)(ulong)in_DIL;
  switch(__lhs) {
  case (char *)0x0:
    std::operator<<(in_RSI,"\\0");
    break;
  default:
    local_10 = in_RSI;
    local_5 = in_DIL;
    bVar1 = IsPrintableAscii((uint)in_DIL);
    if (!bVar1) {
      __rhs = &local_50;
      String::FormatHexInt_abi_cxx11_(in_stack_0000013c);
      std::operator+(__lhs,__rhs);
      std::operator<<(local_10,local_30);
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string((string *)&local_50);
      return kHexEscape;
    }
    std::operator<<(local_10,local_5);
    return kAsIs;
  case (char *)0x7:
    std::operator<<(in_RSI,"\\a");
    break;
  case (char *)0x8:
    std::operator<<(in_RSI,"\\b");
    break;
  case (char *)0x9:
    std::operator<<(in_RSI,"\\t");
    break;
  case (char *)0xa:
    std::operator<<(in_RSI,"\\n");
    break;
  case (char *)0xb:
    std::operator<<(in_RSI,"\\v");
    break;
  case (char *)0xc:
    std::operator<<(in_RSI,"\\f");
    break;
  case (char *)0xd:
    std::operator<<(in_RSI,"\\r");
    break;
  case (char *)0x27:
    std::operator<<(in_RSI,"\\\'");
    break;
  case (char *)0x5c:
    std::operator<<(in_RSI,"\\\\");
  }
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << "\\x" + String::FormatHexInt(static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}